

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_check_mandatory_subtree
              (lyd_node *tree,lyd_node *subtree,lyd_node *last_parent,lys_node *schema,int toplevel,
              int options)

{
  long lVar1;
  LYS_NODE LVar2;
  int iVar3;
  ly_set *set;
  lys_node *plVar4;
  lys_node *node;
  lys_node *plVar5;
  lyd_node *last_parent_00;
  lys_node **pplVar6;
  lyd_node *plVar7;
  lyd_node **pplVar8;
  ulong uVar9;
  
  if (schema == (lys_node *)0x0) {
    __assert_fail("schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xcf,
                  "int lyd_check_mandatory_subtree(struct lyd_node *, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int)"
                 );
  }
  LVar2 = schema->nodetype;
  if ((LVar2 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER)) == LYS_UNKNOWN) {
    set = (ly_set *)0x0;
LAB_0015567d:
    switch(LVar2) {
    case LYS_CONTAINER:
      if ((set->number != 0) ||
         (lVar1._0_2_ = schema[1].flags, lVar1._2_1_ = schema[1].ext_size,
         lVar1._3_1_ = schema[1].iffeature_size, lVar1._4_1_ = schema[1].padding[0],
         lVar1._5_1_ = schema[1].padding[1], lVar1._6_1_ = schema[1].padding[2],
         lVar1._7_1_ = schema[1].padding[3], lVar1 == 0)) {
        pplVar6 = &schema->child;
        do {
          plVar5 = *pplVar6;
          if (plVar5 == (lys_node *)0x0) goto switchD_00155702_caseD_3;
          if (set->number == 0) {
            plVar7 = (lyd_node *)0x0;
            last_parent_00 = last_parent;
          }
          else {
            plVar7 = *(set->set).d;
            last_parent_00 = plVar7;
          }
          iVar3 = lyd_check_mandatory_subtree(tree,plVar7,last_parent_00,plVar5,0,options);
          pplVar6 = &plVar5->next;
        } while (iVar3 == 0);
        goto LAB_00155721;
      }
      break;
    case LYS_CHOICE:
      plVar7 = tree;
      if (tree != (lyd_node *)0x0 && toplevel != 0) goto LAB_0015586a;
      if (subtree == (lyd_node *)0x0 || toplevel != 0) {
LAB_001558b5:
        plVar5 = (lys_node *)schema[1].dsc;
        if (plVar5 != (lys_node *)0x0) goto LAB_001558ea;
        if ((schema->flags & 0x40) == 0) break;
        ly_vlog(LYE_NOMANDCHOICE,LY_VLOG_LYD,last_parent,schema->name);
      }
      else {
        pplVar8 = &subtree->child;
        while( true ) {
          plVar7 = *pplVar8;
LAB_0015586a:
          if (plVar7 == (lyd_node *)0x0) goto LAB_001558b5;
          plVar4 = lys_parent(plVar7->schema);
          plVar5 = plVar7->schema;
          while (((node = plVar4, node != (lys_node *)0x0 && (node != schema)) &&
                 ((node->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN))) {
            plVar4 = lys_parent(node);
            plVar5 = node;
          }
          if (node == schema) break;
          pplVar8 = &plVar7->next;
        }
        if (plVar5 == (lys_node *)0x0) {
          __assert_fail("siter && siter_prev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                        ,300,
                        "int lyd_check_mandatory_subtree(struct lyd_node *, struct lyd_node *, struct lyd_node *, struct lys_node *, int, int)"
                       );
        }
LAB_001558ea:
        iVar3 = lyd_check_mandatory_subtree(tree,subtree,last_parent,plVar5,toplevel,options);
        if (iVar3 == 0) break;
      }
      iVar3 = 1;
      goto LAB_00155912;
    case LYS_CHOICE|LYS_CONTAINER:
    case LYS_LEAF|LYS_CONTAINER:
    case LYS_LEAF|LYS_CHOICE:
    case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
      break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
switchD_00155702_caseD_4:
      iVar3 = lyd_check_mandatory_data(tree,last_parent,set,schema,options);
      if (iVar3 != 0) goto LAB_00155721;
      break;
    default:
      if (LVar2 != LYS_LIST) {
        if (LVar2 != LYS_ANYDATA) {
          if ((((LVar2 == LYS_CASE) || (LVar2 == LYS_NOTIF)) || (LVar2 == LYS_INPUT)) ||
             ((LVar2 == LYS_OUTPUT || (LVar2 == LYS_USES)))) {
            pplVar6 = &schema->child;
            do {
              plVar5 = *pplVar6;
              if (plVar5 == (lys_node *)0x0) goto switchD_00155702_caseD_3;
              iVar3 = lyd_check_mandatory_subtree(tree,subtree,last_parent,plVar5,toplevel,options);
              pplVar6 = &plVar5->next;
            } while (iVar3 == 0);
            goto LAB_00155721;
          }
          if (LVar2 != LYS_ANYXML) break;
        }
        goto switchD_00155702_caseD_4;
      }
      iVar3 = lyd_check_mandatory_data(tree,last_parent,set,schema,options);
      if (iVar3 != 0) goto LAB_00155721;
      for (uVar9 = 0; pplVar6 = &schema->child, uVar9 < set->number; uVar9 = uVar9 + 1) {
        while (plVar5 = *pplVar6, plVar5 != (lys_node *)0x0) {
          iVar3 = lyd_check_mandatory_subtree
                            (tree,(lyd_node *)(set->set).s[uVar9],(lyd_node *)(set->set).s[uVar9],
                             plVar5,0,options);
          pplVar6 = &plVar5->next;
          if (iVar3 != 0) goto LAB_00155721;
        }
      }
    }
switchD_00155702_caseD_3:
    iVar3 = 0;
  }
  else {
    set = ly_set_new();
    if (set != (ly_set *)0x0) {
      plVar7 = tree;
      if (tree == (lyd_node *)0x0 || toplevel == 0) {
        if (subtree != (lyd_node *)0x0 && toplevel == 0) {
          plVar7 = subtree->child;
          goto LAB_0015566d;
        }
      }
      else {
LAB_0015566d:
        lyd_get_node_siblings(plVar7,schema,set);
      }
      LVar2 = schema->nodetype;
      goto LAB_0015567d;
    }
    set = (ly_set *)0x0;
LAB_00155721:
    iVar3 = 1;
  }
LAB_00155912:
  ly_set_free(set);
  return iVar3;
}

Assistant:

static int
lyd_check_mandatory_subtree(struct lyd_node *tree, struct lyd_node *subtree, struct lyd_node *last_parent,
                            struct lys_node *schema, int toplevel, int options)
{
    struct lys_node *siter, *siter_prev;
    struct lyd_node *iter;
    struct ly_set *present = NULL;
    unsigned int u;
    int ret = EXIT_FAILURE;

    assert(schema);

    if (schema->nodetype & (LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_CONTAINER)) {
        /* data node */
        present = ly_set_new();
        if (!present) {
            goto error;
        }
        if ((toplevel && tree) || (!toplevel && subtree)) {
            if (toplevel) {
                lyd_get_node_siblings(tree, schema, present);
            } else {
                lyd_get_node_siblings(subtree->child, schema, present);
            }
        }
    }

    switch (schema->nodetype) {
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* check the schema item */
        if (lyd_check_mandatory_data(tree, last_parent, present, schema, options)) {
            goto error;
        }
        break;
    case LYS_LIST:
        /* check the schema item */
        if (lyd_check_mandatory_data(tree, last_parent, present, schema, options)) {
            goto error;
        }

        /* go recursively */
        for (u = 0; u < present->number; u++) {
            LY_TREE_FOR(schema->child, siter) {
                if (lyd_check_mandatory_subtree(tree, present->set.d[u], present->set.d[u], siter, 0, options)) {
                    goto error;
                }
            }
        }
        break;

    case LYS_CONTAINER:
        if (present->number || !((struct lys_node_container *)schema)->presence) {
            /* if we have existing or non-presence container, go recursively */
            LY_TREE_FOR(schema->child, siter) {
                if (lyd_check_mandatory_subtree(tree, present->number ? present->set.d[0] : NULL,
                                                present->number ? present->set.d[0] : last_parent,
                                                siter, 0, options)) {
                    goto error;
                }
            }
        }
        break;
    case LYS_CHOICE:
        /* get existing node in the data tree from the choice */
        iter = NULL;
        if ((toplevel && tree) || (!toplevel && subtree)) {
            LY_TREE_FOR(toplevel ? tree : subtree->child, iter) {
                for (siter = lys_parent(iter->schema), siter_prev = iter->schema;
                        siter && (siter->nodetype & (LYS_CASE | LYS_USES | LYS_CHOICE));
                        siter_prev = siter, siter = lys_parent(siter)) {
                    if (siter == schema) {
                        /* we have the choice instance */
                        break;
                    }
                }
                if (siter == schema) {
                    /* we have the choice instance;
                     * the condition must be the same as in the loop because of
                     * choice's sibling nodes that break the loop, so siter is not NULL,
                     * but it is not the same as schema */
                    break;
                }
            }
        }
        if (!iter) {
            if (((struct lys_node_choice *)schema)->dflt) {
                /* there is a default case */
                if (lyd_check_mandatory_subtree(tree, subtree, last_parent, ((struct lys_node_choice *)schema)->dflt,
                                                toplevel, options)) {
                    goto error;
                }
            } else if (schema->flags & LYS_MAND_TRUE) {
                /* choice requires some data to be instantiated */
                LOGVAL(LYE_NOMANDCHOICE, LY_VLOG_LYD, last_parent, schema->name);
                goto error;
            }
        } else {
            /* one of the choice's cases is instantiated, continue into this case */
            /* since iter != NULL, siter must be also != NULL and we also know siter_prev
             * which points to the child of schema leading towards the instantiated data */
            assert(siter && siter_prev);
            if (lyd_check_mandatory_subtree(tree, subtree, last_parent, siter_prev, toplevel, options)) {
                goto error;
            }
        }
        break;
    case LYS_CASE:
    case LYS_USES:
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        /* go recursively */
        LY_TREE_FOR(schema->child, siter) {
            if (lyd_check_mandatory_subtree(tree, subtree, last_parent, siter, toplevel, options)) {
                goto error;
            }
        }
        break;
    default:
        /* stop */
        break;
    }

    ret = EXIT_SUCCESS;

error:
    ly_set_free(present);
    return ret;
}